

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildFloat(string_view t_val)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *in_RDX;
  chaiscript *pcVar5;
  element_type *this;
  chaiscript *pcVar6;
  uint uVar7;
  byte bVar8;
  type_conflict2 tVar9;
  type_conflict1 tVar10;
  Boxed_Value BVar11;
  string_view t_str;
  string_view t_str_00;
  string_view t_str_01;
  type_conflict1 local_28 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  pcVar5 = (chaiscript *)t_val._M_str;
  this = (element_type *)t_val._M_len;
  pcVar6 = pcVar5;
  if (pcVar5 == (chaiscript *)0x0) {
    bVar2 = false;
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar1 = false;
    do {
      bVar8 = (in_RDX + -1)[(long)pcVar6] & 0xdf;
      bVar2 = bVar1;
      if (bVar8 == 0x4c) {
        bVar2 = true;
      }
      if (bVar8 == 0x46) {
        bVar3 = true;
        bVar2 = bVar1;
      }
      uVar7 = (byte)(in_RDX + -1)[(long)pcVar6] - 0x46;
      if ((0x26 < uVar7) || ((0x4100000041U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) goto LAB_00345561;
      pcVar6 = pcVar6 + -1;
      bVar1 = bVar2;
    } while (pcVar6 != (chaiscript *)0x0);
    pcVar6 = (chaiscript *)0x0;
  }
LAB_00345561:
  if (bVar3) {
    if (pcVar5 < pcVar6) {
      pcVar6 = pcVar5;
    }
    t_str._M_str = in_RDX;
    t_str._M_len = (size_t)in_RDX;
    tVar9 = parse_num<float>(pcVar6,t_str);
    local_28[0]._0_4_ = tVar9;
    BVar11 = detail::const_var_impl<float>((detail *)this,(float *)local_28);
    _Var4._M_pi = BVar11.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    if (pcVar5 < pcVar6) {
      pcVar6 = pcVar5;
    }
    if (bVar2) {
      t_str_00._M_str = in_RDX;
      t_str_00._M_len = (size_t)in_RDX;
      parse_num<long_double>((type_conflict3 *)pcVar6,t_str_00);
      BVar11 = detail::const_var_impl<long_double>((detail *)this,(longdouble *)local_28);
      _Var4._M_pi = BVar11.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    else {
      t_str_01._M_str = in_RDX;
      t_str_01._M_len = (size_t)in_RDX;
      tVar10 = parse_num<double>(pcVar6,t_str_01);
      local_28[0] = tVar10;
      BVar11 = detail::const_var_impl<double>((detail *)this,local_28);
      _Var4._M_pi = BVar11.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
  }
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (Boxed_Value)
         BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildFloat(std::string_view t_val) {
        bool float_ = false;
        bool long_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          char val = t_val[i - 1];

          if (val == 'f' || val == 'F') {
            float_ = true;
          } else if (val == 'l' || val == 'L') {
            long_ = true;
          } else {
            break;
          }
        }

        if (float_) {
          return const_var(parse_num<float>(t_val.substr(0, i)));
        } else if (long_) {
          return const_var(parse_num<long double>(t_val.substr(0, i)));
        } else {
          return const_var(parse_num<double>(t_val.substr(0, i)));
        }
      }